

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RtMidi.cpp
# Opt level: O3

string * __thiscall
MidiInAlsa::getPortName_abi_cxx11_(string *__return_storage_ptr__,MidiInAlsa *this,uint portNumber)

{
  undefined8 *puVar1;
  snd_seq_t *seq;
  undefined8 uVar2;
  pointer pcVar3;
  size_type sVar4;
  _Alloc_hider _Var5;
  uint uVar6;
  undefined4 uVar7;
  int iVar8;
  long lVar9;
  size_t sVar10;
  char *pcVar11;
  string *this_00;
  void *__s;
  snd_seq_port_info_t *pinfo;
  undefined8 uStack_200;
  long local_1f8;
  ostringstream os;
  ios_base local_188 [264];
  long *local_80 [2];
  long local_70 [2];
  string local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  uStack_200 = 0x10d0f2;
  lVar9 = snd_seq_client_info_sizeof();
  lVar9 = -(lVar9 + 0xfU & 0xfffffffffffffff0);
  __s = (void *)((long)&local_1f8 + lVar9);
  *(undefined8 *)((long)&uStack_200 + lVar9) = 0x10d108;
  sVar10 = snd_seq_client_info_sizeof();
  *(undefined8 *)((long)&uStack_200 + lVar9) = 0x10d115;
  memset(__s,0,sVar10);
  *(undefined8 *)((long)&uStack_200 + lVar9) = 0x10d11a;
  lVar9 = snd_seq_port_info_sizeof();
  pinfo = (snd_seq_port_info_t *)((long)__s - (lVar9 + 0xfU & 0xfffffffffffffff0));
  *(undefined8 *)(pinfo + -8) = 0x10d130;
  sVar10 = snd_seq_port_info_sizeof();
  *(undefined8 *)(pinfo + -8) = 0x10d13d;
  memset(pinfo,0,sVar10);
  local_40 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_40;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  puVar1 = (undefined8 *)(this->super_MidiInApi).super_MidiApi.apiData_;
  seq = (snd_seq_t *)*puVar1;
  local_38 = __return_storage_ptr__;
  *(undefined8 *)(pinfo + -8) = 0x10d16f;
  uVar6 = portInfo(seq,pinfo,0x21,portNumber);
  if (uVar6 == 0) {
    pcVar11 = (char *)(this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
    *(undefined8 *)(pinfo + -8) = 0x10d1e7;
    std::__cxx11::string::_M_replace
              ((ulong)&(this->super_MidiInApi).super_MidiApi.errorString_,0,pcVar11,0x110b0e);
    pcVar3 = (this->super_MidiInApi).super_MidiApi.errorString_._M_dataplus._M_p;
    sVar4 = (this->super_MidiInApi).super_MidiApi.errorString_._M_string_length;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    *(undefined8 *)(pinfo + -8) = 0x10d204;
    std::__cxx11::string::_M_construct<char*>((string *)&local_60,pcVar3,pcVar3 + sVar4);
    *(undefined8 *)(pinfo + -8) = 0x10d212;
    MidiApi::error((MidiApi *)this,WARNING,&local_60);
    this_00 = local_38;
    _Var5._M_p = local_60._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      *(undefined8 *)(pinfo + -8) = 0x10d22f;
      operator_delete(_Var5._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    *(undefined8 *)(pinfo + -8) = 0x10d17b;
    uVar7 = snd_seq_port_info_get_client(pinfo);
    uVar2 = *puVar1;
    *(undefined8 *)(pinfo + -8) = 0x10d188;
    snd_seq_get_any_client_info(uVar2,uVar7,__s);
    this_00 = local_38;
    *(undefined8 *)(pinfo + -8) = 0x10d198;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1f8);
    *(undefined8 *)(pinfo + -8) = 0x10d1a0;
    pcVar11 = (char *)snd_seq_client_info_get_name(__s);
    if (pcVar11 == (char *)0x0) {
      uVar2 = *(undefined8 *)(local_1f8 + -0x18);
      *(undefined8 *)(pinfo + -8) = 0x10d255;
      std::ios::clear((int)uVar2 + (int)&stack0xfffffffffffffff8 + 0xfffffe10);
    }
    else {
      *(undefined8 *)(pinfo + -8) = 0x10d1b4;
      sVar10 = strlen(pcVar11);
      *(undefined8 *)(pinfo + -8) = 0x10d1c6;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,pcVar11,sVar10);
    }
    *(undefined8 *)(pinfo + -8) = 0x10d26d;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,":",1);
    *(undefined8 *)(pinfo + -8) = 0x10d275;
    pcVar11 = (char *)snd_seq_port_info_get_name(pinfo);
    if (pcVar11 == (char *)0x0) {
      uVar2 = *(undefined8 *)(local_1f8 + -0x18);
      *(undefined8 *)(pinfo + -8) = 0x10d2ba;
      std::ios::clear((int)uVar2 + (int)&stack0xfffffffffffffff8 + 0xfffffe10);
    }
    else {
      *(undefined8 *)(pinfo + -8) = 0x10d285;
      sVar10 = strlen(pcVar11);
      *(undefined8 *)(pinfo + -8) = 0x10d297;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,pcVar11,sVar10);
    }
    *(undefined8 *)(pinfo + -8) = 0x10d2d2;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8," ",1);
    *(undefined8 *)(pinfo + -8) = 0x10d2da;
    iVar8 = snd_seq_port_info_get_client(pinfo);
    *(undefined8 *)(pinfo + -8) = 0x10d2e8;
    std::ostream::operator<<((ostream *)&local_1f8,iVar8);
    *(undefined8 *)(pinfo + -8) = 0x10d300;
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_1f8,":",1);
    *(undefined8 *)(pinfo + -8) = 0x10d308;
    iVar8 = snd_seq_port_info_get_port(pinfo);
    *(undefined8 *)(pinfo + -8) = 0x10d316;
    std::ostream::operator<<((ostream *)&local_1f8,iVar8);
    *(undefined8 *)(pinfo + -8) = 0x10d326;
    std::__cxx11::stringbuf::str();
    *(undefined8 *)(pinfo + -8) = 0x10d335;
    std::__cxx11::string::operator=((string *)this_00,(string *)local_80);
    if (local_80[0] != local_70) {
      *(undefined8 *)(pinfo + -8) = 0x10d34d;
      operator_delete(local_80[0],local_70[0] + 1);
    }
    *(undefined8 *)(pinfo + -8) = 0x10d360;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1f8);
    *(undefined8 *)(pinfo + -8) = 0x10d36c;
    std::ios_base::~ios_base(local_188);
  }
  return this_00;
}

Assistant:

std::string MidiInAlsa :: getPortName( unsigned int portNumber )
{
  snd_seq_client_info_t *cinfo;
  snd_seq_port_info_t *pinfo;
  snd_seq_client_info_alloca( &cinfo );
  snd_seq_port_info_alloca( &pinfo );

  std::string stringName;
  AlsaMidiData *data = static_cast<AlsaMidiData *> (apiData_);
  if ( portInfo( data->seq, pinfo, SND_SEQ_PORT_CAP_READ|SND_SEQ_PORT_CAP_SUBS_READ, (int) portNumber ) ) {
    int cnum = snd_seq_port_info_get_client( pinfo );
    snd_seq_get_any_client_info( data->seq, cnum, cinfo );
    std::ostringstream os;
    os << snd_seq_client_info_get_name( cinfo );
    os << ":";
    os << snd_seq_port_info_get_name( pinfo );
    os << " ";                                    // These lines added to make sure devices are listed
    os << snd_seq_port_info_get_client( pinfo );  // with full portnames added to ensure individual device names
    os << ":";
    os << snd_seq_port_info_get_port( pinfo );
    stringName = os.str();
    return stringName;
  }

  // If we get here, we didn't find a match.
  errorString_ = "MidiInAlsa::getPortName: error looking for port name!";
  error( RtMidiError::WARNING, errorString_ );
  return stringName;
}